

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O3

int gost_cipher_do_cfb(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uchar *buf;
  uchar *iv;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  buf = (uchar *)EVP_CIPHER_CTX_buf_noconst();
  iv = (uchar *)EVP_CIPHER_CTX_iv_noconst(ctx);
  iVar2 = EVP_CIPHER_CTX_get_num(ctx);
  if (iVar2 == 0) {
    uVar6 = 0;
  }
  else {
    uVar3 = EVP_CIPHER_CTX_get_num(ctx);
    uVar7 = (ulong)(int)uVar3;
    uVar6 = 0;
    uVar8 = uVar7;
    if (inl != 0 && uVar3 < 8) {
      do {
        iVar2 = EVP_CIPHER_CTX_is_encrypting(ctx);
        bVar1 = *in;
        if (iVar2 == 0) {
          buf[uVar7 + 8] = bVar1;
        }
        out[uVar6] = bVar1 ^ buf[uVar7];
        iVar2 = EVP_CIPHER_CTX_is_encrypting(ctx);
        if (iVar2 != 0) {
          buf[uVar7 + 8] = out[uVar6];
        }
        uVar8 = uVar7 + 1;
        uVar6 = uVar6 + 1;
        in = in + 1;
      } while ((uVar7 < 7) && (uVar7 = uVar8, uVar6 < inl));
      out = out + uVar6;
    }
    if (uVar8 != 8) goto LAB_001126db;
    *(undefined8 *)iv = *(undefined8 *)(buf + 8);
    EVP_CIPHER_CTX_set_num(ctx,0);
  }
  for (; 7 < inl - uVar6; uVar6 = uVar6 + 8) {
    pvVar4 = (void *)EVP_CIPHER_CTX_get_cipher_data(ctx);
    gost_crypt_mesh(pvVar4,iv,buf);
    iVar2 = EVP_CIPHER_CTX_is_encrypting(ctx);
    if (iVar2 == 0) {
      *(undefined8 *)iv = *(undefined8 *)in;
    }
    lVar5 = 0;
    do {
      out[lVar5] = in[lVar5] ^ buf[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 8);
    iVar2 = EVP_CIPHER_CTX_is_encrypting(ctx);
    if (iVar2 != 0) {
      *(undefined8 *)iv = *(undefined8 *)out;
    }
    in = in + 8;
    out = out + 8;
  }
  uVar8 = inl - uVar6;
  if (uVar6 <= inl && uVar8 != 0) {
    pvVar4 = (void *)EVP_CIPHER_CTX_get_cipher_data(ctx);
    gost_crypt_mesh(pvVar4,iv,buf);
    iVar2 = EVP_CIPHER_CTX_is_encrypting(ctx);
    if (iVar2 == 0) {
      memcpy(buf + 8,in,inl - uVar6);
    }
    uVar6 = 0;
    do {
      out[uVar6] = in[uVar6] ^ buf[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
    EVP_CIPHER_CTX_set_num(ctx,uVar8 & 0xffffffff);
    iVar2 = EVP_CIPHER_CTX_is_encrypting(ctx);
    if (iVar2 == 0) {
      return 1;
    }
    memcpy(buf + 8,out,uVar8);
    return 1;
  }
  uVar8 = 0;
LAB_001126db:
  EVP_CIPHER_CTX_set_num(ctx,uVar8);
  return 1;
}

Assistant:

static int gost_cipher_do_cfb(EVP_CIPHER_CTX *ctx, unsigned char *out,
                       const unsigned char *in, size_t inl)
{
    const unsigned char *in_ptr = in;
    unsigned char *out_ptr = out;
    size_t i = 0;
    size_t j = 0;
    unsigned char *buf = EVP_CIPHER_CTX_buf_noconst(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
/* process partial block if any */
    if (EVP_CIPHER_CTX_num(ctx)) {
        for (j = EVP_CIPHER_CTX_num(ctx), i = 0; j < 8 && i < inl;
             j++, i++, in_ptr++, out_ptr++) {
            if (!EVP_CIPHER_CTX_encrypting(ctx))
                buf[j + 8] = *in_ptr;
            *out_ptr = buf[j] ^ (*in_ptr);
            if (EVP_CIPHER_CTX_encrypting(ctx))
                buf[j + 8] = *out_ptr;
        }
        if (j == 8) {
            memcpy(iv, buf + 8, 8);
            EVP_CIPHER_CTX_set_num(ctx, 0);
        } else {
            EVP_CIPHER_CTX_set_num(ctx, j);
            return 1;
        }
    }

    for (; (inl - i) >= 8; i += 8, in_ptr += 8, out_ptr += 8) {
        /*
         * block cipher current iv
         */
        gost_crypt_mesh(EVP_CIPHER_CTX_get_cipher_data(ctx), iv, buf);
        /*
         * xor next block of input text with it and output it
         */
        /*
         * output this block
         */
        if (!EVP_CIPHER_CTX_encrypting(ctx))
            memcpy(iv, in_ptr, 8);
        for (j = 0; j < 8; j++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
        /* Encrypt */
        /* Next iv is next block of cipher text */
        if (EVP_CIPHER_CTX_encrypting(ctx))
            memcpy(iv, out_ptr, 8);
    }
/* Process rest of buffer */
    if (i < inl) {
        gost_crypt_mesh(EVP_CIPHER_CTX_get_cipher_data(ctx), iv, buf);
        if (!EVP_CIPHER_CTX_encrypting(ctx))
            memcpy(buf + 8, in_ptr, inl - i);
        for (j = 0; i < inl; j++, i++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
        EVP_CIPHER_CTX_set_num(ctx, j);
        if (EVP_CIPHER_CTX_encrypting(ctx))
            memcpy(buf + 8, out_ptr, j);
    } else {
        EVP_CIPHER_CTX_set_num(ctx, 0);
    }
    return 1;
}